

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

void __thiscall TextBuffer::Snapshot::~Snapshot(Snapshot *this)

{
  Snapshot *this_local;
  
  if (this->layer->snapshot_count != 0) {
    this->layer->snapshot_count = this->layer->snapshot_count - 1;
    this->base_layer->snapshot_count = this->base_layer->snapshot_count - 1;
    if ((this->layer->snapshot_count == 0) || (this->base_layer->snapshot_count == 0)) {
      consolidate_layers(this->buffer);
    }
    return;
  }
  __assert_fail("layer.snapshot_count > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/superstring/src/core/text-buffer.cc"
                ,0x438,"TextBuffer::Snapshot::~Snapshot()");
}

Assistant:

TextBuffer::Snapshot::~Snapshot() {
  assert(layer.snapshot_count > 0);
  layer.snapshot_count--;
  base_layer.snapshot_count--;
  if (layer.snapshot_count == 0 || base_layer.snapshot_count == 0) {
    buffer.consolidate_layers();
  }
}